

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O1

Interval * tcu::operator/(Interval *__return_storage_ptr__,Interval *nom,Interval *den)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  deRoundingMode dVar5;
  byte bVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar12 = den->m_lo;
  dVar11 = den->m_hi;
  __return_storage_ptr__->m_hasNaN = false;
  if ((0.0 < dVar12) || (dVar11 < 0.0)) {
    __return_storage_ptr__->m_lo = INFINITY;
    __return_storage_ptr__->m_hi = -INFINITY;
    dVar11 = nom->m_lo;
    if (dVar11 < nom->m_hi || dVar11 == nom->m_hi) {
      if (dVar12 < den->m_hi || dVar12 == den->m_hi) {
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar12 = dVar11 / dVar12;
        dVar8 = dVar12;
        if (NAN(dVar12)) {
          dVar8 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar9 = den->m_hi;
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar11 = dVar11 / dVar9;
        dVar9 = dVar11;
        if (NAN(dVar11)) {
          dVar9 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar13 = (double)(-(ulong)NAN(dVar12) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar12) & (ulong)dVar12);
        dVar10 = (double)(-(ulong)NAN(dVar11) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar11) & (ulong)dVar11);
        bVar6 = -(NAN(dVar12) || NAN(dVar11));
        dVar11 = (double)(~-(ulong)(dVar8 <= dVar9) & (ulong)dVar9 |
                         (ulong)dVar8 & -(ulong)(dVar8 <= dVar9));
        uVar7 = -(ulong)(dVar10 <= dVar13);
        dVar12 = (double)(~uVar7 & (ulong)dVar10 | uVar7 & (ulong)dVar13);
      }
      else {
        bVar6 = 0;
        dVar11 = INFINITY;
        dVar12 = -INFINITY;
      }
      dVar9 = -INFINITY;
      dVar13 = INFINITY;
      bVar1 = den->m_hasNaN;
      dVar8 = den->m_lo;
      if (dVar8 < den->m_hi || dVar8 == den->m_hi) {
        dVar9 = nom->m_hi;
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar8 = dVar9 / dVar8;
        dVar13 = dVar8;
        if (NAN(dVar8)) {
          dVar13 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar10 = den->m_hi;
        dVar5 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar9 = dVar9 / dVar10;
        dVar10 = dVar9;
        if (NAN(dVar9)) {
          dVar10 = INFINITY;
        }
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        deSetRoundingMode(dVar5);
        dVar2 = (double)(-(ulong)NAN(dVar8) & 0xfff0000000000000 |
                        ~-(ulong)NAN(dVar8) & (ulong)dVar8);
        dVar3 = (double)(-(ulong)NAN(dVar9) & 0xfff0000000000000 |
                        ~-(ulong)NAN(dVar9) & (ulong)dVar9);
        bVar4 = (bool)((-NAN(dVar8) | -NAN(dVar9)) & 1);
        dVar13 = (double)(~-(ulong)(dVar13 <= dVar10) & (ulong)dVar10 |
                         (ulong)dVar13 & -(ulong)(dVar13 <= dVar10));
        uVar7 = -(ulong)(dVar3 <= dVar2);
        dVar9 = (double)(~uVar7 & (ulong)dVar3 | uVar7 & (ulong)dVar2);
      }
      else {
        bVar4 = false;
      }
      if ((den->m_hasNaN & 1U) != 0) {
        bVar4 = true;
      }
      if (((bVar1 | bVar6) & 1) != 0) {
        bVar4 = true;
      }
      dVar11 = (double)(~-(ulong)(dVar11 <= dVar13) & (ulong)dVar13 |
                       (ulong)dVar11 & -(ulong)(dVar11 <= dVar13));
      dVar12 = (double)(~-(ulong)(dVar9 <= dVar12) & (ulong)dVar9 |
                       (ulong)dVar12 & -(ulong)(dVar9 <= dVar12));
    }
    else {
      dVar12 = -INFINITY;
      dVar11 = INFINITY;
      bVar4 = false;
    }
    __return_storage_ptr__->m_hasNaN = bVar4;
    __return_storage_ptr__->m_lo = dVar11;
    __return_storage_ptr__->m_hi = dVar12;
    if (nom->m_hasNaN != true) {
      return __return_storage_ptr__;
    }
    dVar12 = __return_storage_ptr__->m_lo;
    if (INFINITY <= dVar12) {
      dVar12 = INFINITY;
    }
    dVar11 = __return_storage_ptr__->m_hi;
    if (dVar11 <= -INFINITY) {
      dVar11 = -INFINITY;
    }
    __return_storage_ptr__->m_hasNaN = true;
  }
  else {
    dVar11 = INFINITY;
    dVar12 = -INFINITY;
  }
  __return_storage_ptr__->m_lo = dVar12;
  __return_storage_ptr__->m_hi = dVar11;
  return __return_storage_ptr__;
}

Assistant:

Interval operator/ (const Interval& nom, const Interval& den)
{
	if (den.contains(0.0))
	{
		// \todo [2014-03-21 lauri] Non-inf endpoint when one den endpoint is
		// zero and nom doesn't cross zero?
		return Interval::unbounded();
	}
	else
	{
		Interval ret;

		TCU_INTERVAL_APPLY_MONOTONE2(ret, nomp, nom, denp, den, val,
									 TCU_SET_INTERVAL(val, point, point = nomp / denp));
		return ret;
	}
}